

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

void Supp_ManStop(Supp_Man_t *p)

{
  Vec_Ptr_t *p_00;
  void *__ptr;
  int i;
  int i_00;
  
  for (i_00 = 0; p_00 = p->vMemory, i_00 < p_00->nSize; i_00 = i_00 + 1) {
    __ptr = Vec_PtrEntry(p_00,i_00);
    free(__ptr);
  }
  Vec_PtrFree(p_00);
  Vec_PtrFree(p->vFree);
  free(p);
  return;
}

Assistant:

void Supp_ManStop( Supp_Man_t * p )
{
    void * pMemory;
    int i;
    Vec_PtrForEachEntry( void *, p->vMemory, pMemory, i )
        ABC_FREE( pMemory );
    Vec_PtrFree( p->vMemory );
    Vec_PtrFree( p->vFree );
    ABC_FREE( p );
}